

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::advance_past_empty_and_deleted
          (dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  bool bVar1;
  pointer ppcVar2;
  
  ppcVar2 = this->pos;
  while( true ) {
    if (ppcVar2 == this->end) {
      return;
    }
    bVar1 = dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
            ::test_empty(this->ht,this);
    if ((!bVar1) &&
       (bVar1 = dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                ::test_deleted(this->ht,this), !bVar1)) break;
    ppcVar2 = this->pos + 1;
    this->pos = ppcVar2;
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }